

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O0

Edits * __thiscall
icu_63::Edits::mergeAndAppend(Edits *this,Edits *ab,Edits *bc,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int local_c0;
  int local_ac;
  int32_t unchangedLength;
  int32_t pending_cLength;
  int32_t pending_aLength;
  int32_t cLength;
  int32_t bc_bLength;
  int32_t ab_bLength;
  int32_t aLength;
  UBool bcHasNext;
  UBool abHasNext;
  Iterator bcIter;
  Iterator abIter;
  UErrorCode *errorCode_local;
  Edits *bc_local;
  Edits *ab_local;
  Edits *this_local;
  
  UVar1 = copyErrorTo(this,errorCode);
  if (UVar1 != '\0') {
    return this;
  }
  getFineIterator((Iterator *)&bcIter.destIndex,ab);
  getFineIterator((Iterator *)&aLength,bc);
  ab_bLength._3_1_ = '\x01';
  ab_bLength._2_1_ = '\x01';
  bc_bLength = 0;
  cLength = 0;
  pending_aLength = 0;
  pending_cLength = 0;
  unchangedLength = 0;
  local_ac = 0;
LAB_003d249a:
  while (((pending_aLength == 0 && (ab_bLength._2_1_ != '\0')) &&
         (ab_bLength._2_1_ = Iterator::next((Iterator *)&aLength,errorCode),
         ab_bLength._2_1_ != '\0'))) {
    pending_aLength = Iterator::oldLength((Iterator *)&aLength);
    pending_cLength = Iterator::newLength((Iterator *)&aLength);
    if (pending_aLength != 0) break;
    if ((cLength == 0) ||
       (UVar1 = Iterator::hasChange((Iterator *)&bcIter.destIndex), UVar1 == '\0')) {
      addReplace(this,unchangedLength,local_ac + pending_cLength);
      local_ac = 0;
      unchangedLength = 0;
    }
    else {
      local_ac = pending_cLength + local_ac;
    }
  }
  if (cLength == 0) {
    if ((ab_bLength._3_1_ == '\0') ||
       (ab_bLength._3_1_ = Iterator::next((Iterator *)&bcIter.destIndex,errorCode),
       ab_bLength._3_1_ == '\0')) {
      if (pending_aLength == 0) {
        if ((unchangedLength != 0) || (local_ac != 0)) {
          addReplace(this,unchangedLength,local_ac);
        }
        copyErrorTo(this,errorCode);
        return this;
      }
      UVar1 = copyErrorTo(this,errorCode);
      if (UVar1 != '\0') {
        return this;
      }
      *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return this;
    }
    bc_bLength = Iterator::oldLength((Iterator *)&bcIter.destIndex);
    cLength = Iterator::newLength((Iterator *)&bcIter.destIndex);
    if (cLength == 0) {
      iVar2 = Iterator::oldLength((Iterator *)&aLength);
      if ((pending_aLength == iVar2) ||
         (UVar1 = Iterator::hasChange((Iterator *)&aLength), UVar1 == '\0')) {
        addReplace(this,unchangedLength + bc_bLength,local_ac);
        local_ac = 0;
        unchangedLength = 0;
      }
      else {
        unchangedLength = bc_bLength + unchangedLength;
      }
      goto LAB_003d249a;
    }
  }
  if (pending_aLength == 0) {
    UVar1 = copyErrorTo(this,errorCode);
    if (UVar1 != '\0') {
      return this;
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return this;
  }
  UVar1 = Iterator::hasChange((Iterator *)&bcIter.destIndex);
  if ((UVar1 == '\0') && (UVar1 = Iterator::hasChange((Iterator *)&aLength), UVar1 == '\0')) {
    if ((unchangedLength != 0) || (local_ac != 0)) {
      addReplace(this,unchangedLength,local_ac);
      local_ac = 0;
      unchangedLength = 0;
    }
    if (pending_cLength < bc_bLength) {
      local_c0 = pending_cLength;
    }
    else {
      local_c0 = bc_bLength;
    }
    addUnchanged(this,local_c0);
    cLength = bc_bLength - local_c0;
    pending_cLength = pending_cLength - local_c0;
    pending_aLength = pending_cLength;
    bc_bLength = cLength;
    goto LAB_003d249a;
  }
  UVar1 = Iterator::hasChange((Iterator *)&bcIter.destIndex);
  if ((UVar1 == '\0') && (UVar1 = Iterator::hasChange((Iterator *)&aLength), UVar1 != '\0')) {
    if (pending_aLength <= cLength) {
      addReplace(this,unchangedLength + pending_aLength,local_ac + pending_cLength);
      local_ac = 0;
      unchangedLength = 0;
      cLength = cLength - pending_aLength;
      pending_aLength = 0;
      bc_bLength = cLength;
      goto LAB_003d249a;
    }
  }
  else {
    UVar1 = Iterator::hasChange((Iterator *)&bcIter.destIndex);
    if ((UVar1 == '\0') || (UVar1 = Iterator::hasChange((Iterator *)&aLength), UVar1 != '\0')) {
      if (cLength == pending_aLength) {
        addReplace(this,unchangedLength + bc_bLength,local_ac + pending_cLength);
        local_ac = 0;
        unchangedLength = 0;
        pending_aLength = 0;
        cLength = 0;
        goto LAB_003d249a;
      }
    }
    else if (cLength <= pending_aLength) {
      addReplace(this,unchangedLength + bc_bLength,local_ac + cLength);
      local_ac = 0;
      unchangedLength = 0;
      pending_cLength = pending_aLength - cLength;
      cLength = 0;
      pending_aLength = pending_cLength;
      goto LAB_003d249a;
    }
  }
  unchangedLength = bc_bLength + unchangedLength;
  local_ac = pending_cLength + local_ac;
  if (cLength < pending_aLength) {
    pending_aLength = pending_aLength - cLength;
    cLength = 0;
    pending_cLength = 0;
  }
  else {
    cLength = cLength - pending_aLength;
    pending_aLength = 0;
    bc_bLength = 0;
  }
  goto LAB_003d249a;
}

Assistant:

Edits &Edits::mergeAndAppend(const Edits &ab, const Edits &bc, UErrorCode &errorCode) {
    if (copyErrorTo(errorCode)) { return *this; }
    // Picture string a --(Edits ab)--> string b --(Edits bc)--> string c.
    // Parallel iteration over both Edits.
    Iterator abIter = ab.getFineIterator();
    Iterator bcIter = bc.getFineIterator();
    UBool abHasNext = TRUE, bcHasNext = TRUE;
    // Copy iterator state into local variables, so that we can modify and subdivide spans.
    // ab old & new length, bc old & new length
    int32_t aLength = 0, ab_bLength = 0, bc_bLength = 0, cLength = 0;
    // When we have different-intermediate-length changes, we accumulate a larger change.
    int32_t pending_aLength = 0, pending_cLength = 0;
    for (;;) {
        // At this point, for each of the two iterators:
        // Either we are done with the locally cached current edit,
        // and its intermediate-string length has been reset,
        // or we will continue to work with a truncated remainder of this edit.
        //
        // If the current edit is done, and the iterator has not yet reached the end,
        // then we fetch the next edit. This is true for at least one of the iterators.
        //
        // Normally it does not matter whether we fetch from ab and then bc or vice versa.
        // However, the result is observably different when
        // ab deletions meet bc insertions at the same intermediate-string index.
        // Some users expect the bc insertions to come first, so we fetch from bc first.
        if (bc_bLength == 0) {
            if (bcHasNext && (bcHasNext = bcIter.next(errorCode)) != 0) {
                bc_bLength = bcIter.oldLength();
                cLength = bcIter.newLength();
                if (bc_bLength == 0) {
                    // insertion
                    if (ab_bLength == 0 || !abIter.hasChange()) {
                        addReplace(pending_aLength, pending_cLength + cLength);
                        pending_aLength = pending_cLength = 0;
                    } else {
                        pending_cLength += cLength;
                    }
                    continue;
                }
            }
            // else see if the other iterator is done, too.
        }
        if (ab_bLength == 0) {
            if (abHasNext && (abHasNext = abIter.next(errorCode)) != 0) {
                aLength = abIter.oldLength();
                ab_bLength = abIter.newLength();
                if (ab_bLength == 0) {
                    // deletion
                    if (bc_bLength == bcIter.oldLength() || !bcIter.hasChange()) {
                        addReplace(pending_aLength + aLength, pending_cLength);
                        pending_aLength = pending_cLength = 0;
                    } else {
                        pending_aLength += aLength;
                    }
                    continue;
                }
            } else if (bc_bLength == 0) {
                // Both iterators are done at the same time:
                // The intermediate-string lengths match.
                break;
            } else {
                // The ab output string is shorter than the bc input string.
                if (!copyErrorTo(errorCode)) {
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                }
                return *this;
            }
        }
        if (bc_bLength == 0) {
            // The bc input string is shorter than the ab output string.
            if (!copyErrorTo(errorCode)) {
                errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            }
            return *this;
        }
        //  Done fetching: ab_bLength > 0 && bc_bLength > 0

        // The current state has two parts:
        // - Past: We accumulate a longer ac edit in the "pending" variables.
        // - Current: We have copies of the current ab/bc edits in local variables.
        //   At least one side is newly fetched.
        //   One side might be a truncated remainder of an edit we fetched earlier.

        if (!abIter.hasChange() && !bcIter.hasChange()) {
            // An unchanged span all the way from string a to string c.
            if (pending_aLength != 0 || pending_cLength != 0) {
                addReplace(pending_aLength, pending_cLength);
                pending_aLength = pending_cLength = 0;
            }
            int32_t unchangedLength = aLength <= cLength ? aLength : cLength;
            addUnchanged(unchangedLength);
            ab_bLength = aLength -= unchangedLength;
            bc_bLength = cLength -= unchangedLength;
            // At least one of the unchanged spans is now empty.
            continue;
        }
        if (!abIter.hasChange() && bcIter.hasChange()) {
            // Unchanged a->b but changed b->c.
            if (ab_bLength >= bc_bLength) {
                // Split the longer unchanged span into change + remainder.
                addReplace(pending_aLength + bc_bLength, pending_cLength + cLength);
                pending_aLength = pending_cLength = 0;
                aLength = ab_bLength -= bc_bLength;
                bc_bLength = 0;
                continue;
            }
            // Handle the shorter unchanged span below like a change.
        } else if (abIter.hasChange() && !bcIter.hasChange()) {
            // Changed a->b and then unchanged b->c.
            if (ab_bLength <= bc_bLength) {
                // Split the longer unchanged span into change + remainder.
                addReplace(pending_aLength + aLength, pending_cLength + ab_bLength);
                pending_aLength = pending_cLength = 0;
                cLength = bc_bLength -= ab_bLength;
                ab_bLength = 0;
                continue;
            }
            // Handle the shorter unchanged span below like a change.
        } else {  // both abIter.hasChange() && bcIter.hasChange()
            if (ab_bLength == bc_bLength) {
                // Changes on both sides up to the same position. Emit & reset.
                addReplace(pending_aLength + aLength, pending_cLength + cLength);
                pending_aLength = pending_cLength = 0;
                ab_bLength = bc_bLength = 0;
                continue;
            }
        }
        // Accumulate the a->c change, reset the shorter side,
        // keep a remainder of the longer one.
        pending_aLength += aLength;
        pending_cLength += cLength;
        if (ab_bLength < bc_bLength) {
            bc_bLength -= ab_bLength;
            cLength = ab_bLength = 0;
        } else {  // ab_bLength > bc_bLength
            ab_bLength -= bc_bLength;
            aLength = bc_bLength = 0;
        }
    }
    if (pending_aLength != 0 || pending_cLength != 0) {
        addReplace(pending_aLength, pending_cLength);
    }
    copyErrorTo(errorCode);
    return *this;
}